

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  bool bVar1;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_t local_60;
  size_t max_options;
  size_t local_48;
  size_t min_options;
  string desc;
  App *app_local;
  Formatter *this_local;
  
  desc.field_2._8_8_ = app;
  App::get_description_abi_cxx11_((string *)&min_options,app);
  local_48 = App::get_require_option_min((App *)desc.field_2._8_8_);
  local_60 = App::get_require_option_max((App *)desc.field_2._8_8_);
  bVar1 = App::get_required((App *)desc.field_2._8_8_);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&min_options,
               " REQUIRED ");
  }
  if ((local_60 == local_48) && (local_48 != 0)) {
    if (local_48 == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&min_options,
                 " \n[Exactly 1 of the following options is required]");
    }
    else {
      ::std::__cxx11::to_string(&local_c0,local_48);
      ::std::operator+(&local_a0," \n[Exactly ",&local_c0);
      ::std::operator+(&local_80,&local_a0,"options from the following list are required]");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&min_options,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  else if (local_60 == 0) {
    if (local_48 != 0) {
      ::std::__cxx11::to_string(&local_240,local_48);
      ::std::operator+(&local_220," \n[At least ",&local_240);
      ::std::operator+(&local_200,&local_220," of the following options are required]");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&min_options,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::__cxx11::string::~string((string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_240);
    }
  }
  else if (local_48 == 0) {
    ::std::__cxx11::to_string(&local_1e0,local_60);
    ::std::operator+(&local_1c0," \n[At most ",&local_1e0);
    ::std::operator+(&local_1a0,&local_1c0," of the following options are allowed]");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&min_options,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    ::std::__cxx11::to_string(&local_160,local_48);
    ::std::operator+(&local_140," \n[Between ",&local_160);
    ::std::operator+(&local_120,&local_140," and ");
    ::std::__cxx11::to_string(&local_180,local_60);
    ::std::operator+(&local_100,&local_120,&local_180);
    ::std::operator+(&local_e0,&local_100," of the follow options are required]");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&min_options,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_180);
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_160);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &min_options);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &min_options,"\n");
  }
  ::std::__cxx11::string::~string((string *)&min_options);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " REQUIRED ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + "options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}